

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LaneBasedExecutionQueue.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_23223e::LaneBasedExecutionQueue::addJob
          (LaneBasedExecutionQueue *this,QueueJob *job,QueueJobPriority priority)

{
  _Manager_type p_Var1;
  Scheduler *pSVar2;
  int iVar3;
  _Any_data *p_Var4;
  value_type *__x;
  value_type local_80;
  value_type local_58;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->readyJobsMutex);
  if (iVar3 == 0) {
    if (priority == High) {
      local_58.desc = job->desc;
      p_Var4 = (_Any_data *)&local_58.work;
      local_58.work.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
      local_58.work.super__Function_base._M_functor._8_8_ = 0;
      local_58.work.super__Function_base._M_manager = (_Manager_type)0x0;
      local_58.work._M_invoker = (_Invoker_type)0x0;
      p_Var1 = (job->work).super__Function_base._M_manager;
      if (p_Var1 != (_Manager_type)0x0) {
        (*p_Var1)(p_Var4,(_Any_data *)&job->work,__clone_functor);
        local_58.work._M_invoker = (job->work)._M_invoker;
        local_58.work.super__Function_base._M_manager = (job->work).super__Function_base._M_manager;
      }
      __x = &local_58;
      std::deque<llbuild::basic::QueueJob,_std::allocator<llbuild::basic::QueueJob>_>::push_back
                (&(this->readyPriorityJobs).jobs,__x);
    }
    else {
      pSVar2 = (this->readyJobs)._M_t.
               super___uniq_ptr_impl<(anonymous_namespace)::Scheduler,_std::default_delete<(anonymous_namespace)::Scheduler>_>
               ._M_t.
               super__Tuple_impl<0UL,_(anonymous_namespace)::Scheduler_*,_std::default_delete<(anonymous_namespace)::Scheduler>_>
               .super__Head_base<0UL,_(anonymous_namespace)::Scheduler_*,_false>._M_head_impl;
      local_80.desc = job->desc;
      p_Var4 = (_Any_data *)&local_80.work;
      local_80.work.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
      local_80.work.super__Function_base._M_functor._8_8_ = 0;
      local_80.work.super__Function_base._M_manager = (_Manager_type)0x0;
      local_80.work._M_invoker = (_Invoker_type)0x0;
      p_Var1 = (job->work).super__Function_base._M_manager;
      if (p_Var1 != (_Manager_type)0x0) {
        (*p_Var1)(p_Var4,(_Any_data *)&job->work,__clone_functor);
        local_80.work._M_invoker = (job->work)._M_invoker;
        local_80.work.super__Function_base._M_manager = (job->work).super__Function_base._M_manager;
      }
      __x = &local_80;
      (*pSVar2->_vptr_Scheduler[2])(pSVar2,__x);
    }
    p_Var1 = (__x->work).super__Function_base._M_manager;
    if (p_Var1 != (_Manager_type)0x0) {
      (*p_Var1)(p_Var4,p_Var4,__destroy_functor);
    }
    std::condition_variable::notify_one();
    (*((this->readyJobs)._M_t.
       super___uniq_ptr_impl<(anonymous_namespace)::Scheduler,_std::default_delete<(anonymous_namespace)::Scheduler>_>
       ._M_t.
       super__Tuple_impl<0UL,_(anonymous_namespace)::Scheduler_*,_std::default_delete<(anonymous_namespace)::Scheduler>_>
       .super__Head_base<0UL,_(anonymous_namespace)::Scheduler_*,_false>._M_head_impl)->
      _vptr_Scheduler[5])();
    pthread_mutex_unlock((pthread_mutex_t *)&this->readyJobsMutex);
    return;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

virtual void addJob(QueueJob job, QueueJobPriority priority) override {
    uint64_t readyJobsCount;
    {
      std::lock_guard<std::mutex> guard(readyJobsMutex);
      if (priority == QueueJobPriority::High) {
        readyPriorityJobs.addJob(job);
      } else {
        readyJobs->addJob(job);
      }
      readyJobsCondition.notify_one();
      readyJobsCount = readyJobs->size();
    }
    TracingExecutionQueueDepth(readyJobsCount);
  }